

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecPolyn.c
# Opt level: O0

void Gia_PolynBuildAdd(Pln_Man_t *p,Vec_Int_t *vTempC,Vec_Int_t *vTempM)

{
  Vec_Flt_t *p_00;
  Vec_Int_t *p_01;
  int iVar1;
  int iVar2;
  int local_30;
  int iMono;
  int iConstNew;
  int iConst;
  Vec_Int_t *vTempM_local;
  Vec_Int_t *vTempC_local;
  Pln_Man_t *p_local;
  
  if (vTempM == (Vec_Int_t *)0x0) {
    local_30 = 0;
  }
  else {
    local_30 = Hsh_VecManAdd(p->pHashM,vTempM);
  }
  p->nBuilds = p->nBuilds + 1;
  iVar1 = Vec_IntSize(p->vCoefs);
  if (local_30 == iVar1) {
    iVar1 = Hsh_VecManAdd(p->pHashC,vTempC);
    Vec_IntPush(p->vCoefs,iVar1);
    p_00 = p->vCounts;
    p_01 = p->vOrder;
    iVar2 = Vec_IntEntryLast(vTempM);
    iVar2 = Vec_IntEntry(p_01,iVar2);
    Vec_FltPush(p_00,(float)iVar2);
    Vec_QuePush(p->vQue,local_30);
    if (iVar1 != 0) {
      p->nUsed = p->nUsed + 1;
    }
  }
  else {
    iVar1 = Vec_IntEntry(p->vCoefs,local_30);
    if (iVar1 != 0) {
      Gia_PolynMergeConst(vTempC,p,iVar1);
    }
    iVar2 = Hsh_VecManAdd(p->pHashC,vTempC);
    Vec_IntWriteEntry(p->vCoefs,local_30,iVar2);
    if ((iVar1 == 0) || (iVar2 != 0)) {
      if ((iVar1 == 0) && (iVar2 != 0)) {
        p->nUsed = p->nUsed + 1;
      }
    }
    else {
      p->nUsed = p->nUsed + -1;
    }
  }
  return;
}

Assistant:

static inline void Gia_PolynBuildAdd( Pln_Man_t * p, Vec_Int_t * vTempC, Vec_Int_t * vTempM )
{
    int iConst, iConstNew, iMono = vTempM ? Hsh_VecManAdd(p->pHashM, vTempM) : 0;
    p->nBuilds++;
    if ( iMono == Vec_IntSize(p->vCoefs) ) // new monomial
    {
        iConst = Hsh_VecManAdd( p->pHashC, vTempC );
        Vec_IntPush( p->vCoefs, iConst );
//        Vec_FltPush( p->vCounts, Vec_IntEntryLast(vTempM) );
        Vec_FltPush( p->vCounts, (float)Vec_IntEntry(p->vOrder, Vec_IntEntryLast(vTempM)) );
        Vec_QuePush( p->vQue, iMono );
//        Vec_QueUpdate( p->vQue, iMono );
        if ( iConst )
            p->nUsed++;
        return;
    }
    // this monomial exists
    iConst = Vec_IntEntry( p->vCoefs, iMono );
    if ( iConst )
        Gia_PolynMergeConst( vTempC, p, iConst );
    iConstNew = Hsh_VecManAdd( p->pHashC, vTempC );
    Vec_IntWriteEntry( p->vCoefs, iMono, iConstNew );
    if ( iConst && !iConstNew )
        p->nUsed--;
    else if ( !iConst && iConstNew )
        p->nUsed++;
    //assert( p->nUsed == Vec_IntSize(p->vCoefs) - Vec_IntCountZero(p->vCoefs) );
}